

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O2

Curl_addrinfo * Curl_doh(connectdata *conn,char *hostname,int port,int *waitp)

{
  dohdata *__s;
  uint *puVar1;
  Curl_easy *data;
  CURLcode CVar2;
  curl_slist *headers;
  
  data = conn->data;
  *waitp = 1;
  __s = &(data->req).doh;
  memset(__s,0,0x470);
  (data->req).doh.host = hostname;
  (data->req).doh.port = port;
  headers = curl_slist_append((curl_slist *)0x0,"Content-Type: application/dns-message");
  (data->req).doh.headers = headers;
  if (headers != (curl_slist *)0x0) {
    if (conn->ip_version != 2) {
      CVar2 = dohprobe(data,(data->req).doh.probe,DNS_TYPE_A,hostname,(data->set).str[0x3b],
                       data->multi,headers);
      if (CVar2 != CURLE_OK) goto LAB_003d77c7;
      puVar1 = &(data->req).doh.pending;
      *puVar1 = *puVar1 + 1;
      if (conn->ip_version == 1) {
        return (Curl_addrinfo *)0x0;
      }
      headers = __s->headers;
    }
    CVar2 = dohprobe(data,(data->req).doh.probe + 1,DNS_TYPE_AAAA,hostname,(data->set).str[0x3b],
                     data->multi,headers);
    if (CVar2 == CURLE_OK) {
      puVar1 = &(data->req).doh.pending;
      *puVar1 = *puVar1 + 1;
      return (Curl_addrinfo *)0x0;
    }
  }
LAB_003d77c7:
  curl_slist_free_all((data->req).doh.headers);
  (data->req).doh.headers = (curl_slist *)0x0;
  curl_easy_cleanup((data->req).doh.probe[0].easy);
  (data->req).doh.probe[0].easy = (CURL_conflict *)0x0;
  curl_easy_cleanup((data->req).doh.probe[1].easy);
  (data->req).doh.probe[1].easy = (CURL_conflict *)0x0;
  return (Curl_addrinfo *)0x0;
}

Assistant:

Curl_addrinfo *Curl_doh(struct connectdata *conn,
                        const char *hostname,
                        int port,
                        int *waitp)
{
  struct Curl_easy *data = conn->data;
  CURLcode result = CURLE_OK;
  *waitp = TRUE; /* this never returns synchronously */
  (void)conn;
  (void)hostname;
  (void)port;

  /* start clean, consider allocating this struct on demand */
  memset(&data->req.doh, 0, sizeof(struct dohdata));

  data->req.doh.host = hostname;
  data->req.doh.port = port;
  data->req.doh.headers =
    curl_slist_append(NULL,
                      "Content-Type: application/dns-message");
  if(!data->req.doh.headers)
    goto error;

  if(conn->ip_version != CURL_IPRESOLVE_V6) {
    /* create IPv4 DOH request */
    result = dohprobe(data, &data->req.doh.probe[0], DNS_TYPE_A,
                      hostname, data->set.str[STRING_DOH],
                      data->multi, data->req.doh.headers);
    if(result)
      goto error;
    data->req.doh.pending++;
  }

  if(conn->ip_version != CURL_IPRESOLVE_V4) {
    /* create IPv6 DOH request */
    result = dohprobe(data, &data->req.doh.probe[1], DNS_TYPE_AAAA,
                      hostname, data->set.str[STRING_DOH],
                      data->multi, data->req.doh.headers);
    if(result)
      goto error;
    data->req.doh.pending++;
  }
  return NULL;

  error:
  curl_slist_free_all(data->req.doh.headers);
  data->req.doh.headers = NULL;
  curl_easy_cleanup(data->req.doh.probe[0].easy);
  data->req.doh.probe[0].easy = NULL;
  curl_easy_cleanup(data->req.doh.probe[1].easy);
  data->req.doh.probe[1].easy = NULL;
  return NULL;
}